

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  BT<cmSourceFile_*> *v;
  pointer __x;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> tmp;
  
  GetSourceFilesWithoutObjectLibraries(&tmp,this,config);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve
            (files,((long)tmp.
                          super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tmp.
                         super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (__x = tmp.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      __x != tmp.super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>.
             _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(files,&__x->Value);
  }
  std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::~vector(&tmp);
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries(
  std::vector<cmSourceFile*>& files, const std::string& config) const
{
  std::vector<BT<cmSourceFile*>> tmp =
    this->GetSourceFilesWithoutObjectLibraries(config);
  files.reserve(tmp.size());
  for (BT<cmSourceFile*>& v : tmp) {
    files.push_back(v.Value);
  }
}